

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child,int options)

{
  lys_module *plVar1;
  LYS_NODE LVar2;
  LYS_NODE LVar3;
  LY_STMT stmt;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  lys_node **pplVar7;
  lys_node *plVar8;
  lys_node *plVar9;
  char *pcVar10;
  lys_node *plVar11;
  LY_VLOG_ELEM elem_type;
  LY_ECODE ecode;
  ly_ctx *plVar12;
  bool bVar13;
  lyext_substmt *local_48;
  lyext_substmt *info;
  ly_ctx *local_38;
  
  local_38 = child->module->ctx;
  local_48 = (lyext_substmt *)0x0;
  info._4_4_ = options;
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31a,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
    if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31b,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
LAB_0015acbf:
    plVar8 = (lys_node *)0x0;
switchD_0015ad83_caseD_0:
    bVar13 = true;
    if ((child->nodetype & 0xb9bf) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      pcVar10 = "(sub)module";
LAB_0015adad:
      ecode = LYE_INCHILDSTMT;
      elem_type = LY_VLOG_LYS;
      plVar12 = local_38;
LAB_0015b019:
      ly_vlog(plVar12,ecode,elem_type,plVar8,pcVar6,pcVar10);
      return 1;
    }
  }
  else {
    LVar3 = parent->nodetype;
    module = parent->module;
    plVar8 = parent;
    if (LVar3 == LYS_USES) {
      do {
        LVar3 = plVar8->nodetype;
        if (LVar3 != LYS_USES) goto LAB_0015ac39;
        pplVar7 = &plVar8->parent;
        plVar8 = *pplVar7;
      } while (*pplVar7 != (lys_node *)0x0);
      goto LAB_0015acbf;
    }
LAB_0015ac39:
    bVar13 = true;
    if ((int)LVar3 < 0x80) {
      if (0xf < (int)LVar3) {
        if (LVar3 == LYS_LIST) {
switchD_0015ad83_caseD_1:
          LVar3 = child->nodetype;
          LVar2 = LVar3 & 0xd8bf;
joined_r0x0015afb5:
          if (LVar2 == LYS_UNKNOWN) goto LAB_0015aff1;
        }
        else {
          if (LVar3 == LYS_ANYXML) goto switchD_0015ad83_caseD_4;
          if ((LVar3 == LYS_CASE) && ((child->nodetype & 0x903f) == LYS_UNKNOWN)) {
            pcVar6 = strnodetype(child->nodetype);
            pcVar10 = "case";
            goto LAB_0015adad;
          }
        }
        goto switchD_0015ad83_caseD_3;
      }
      switch(LVar3) {
      case LYS_UNKNOWN:
        goto switchD_0015ad83_caseD_0;
      case LYS_CONTAINER:
        goto switchD_0015ad83_caseD_1;
      case LYS_CHOICE:
        LVar3 = child->nodetype;
        if ((LVar3 & 0x807f) != LYS_UNKNOWN) {
          bVar13 = LVar3 == LYS_CASE;
          goto switchD_0015ad83_caseD_3;
        }
        pcVar6 = strnodetype(LVar3);
        pcVar10 = "choice";
        break;
      default:
        goto switchD_0015ad83_caseD_3;
      case LYS_LEAF:
      case LYS_LEAFLIST:
switchD_0015ad83_caseD_4:
        pcVar10 = strnodetype(child->nodetype);
        pcVar6 = strnodetype(plVar8->nodetype);
        plVar12 = local_38;
        ly_vlog(local_38,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar8,pcVar10,pcVar6);
        pcVar10 = strnodetype(plVar8->nodetype);
        pcVar6 = "The \"%s\" statement cannot have any data substatement.";
        ecode = LYE_SPEC;
        elem_type = LY_VLOG_PREV;
        plVar8 = (lys_node *)0x0;
        goto LAB_0015b019;
      }
      goto LAB_0015adad;
    }
    if (0x7ff < (int)LVar3) {
      if (0x3fff < (int)LVar3) {
        if (LVar3 == LYS_ACTION) {
LAB_0015aed7:
          if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
            pcVar6 = strnodetype(child->nodetype);
            pcVar10 = "rpc";
            goto LAB_0015adad;
          }
        }
        else {
          if (LVar3 == LYS_ANYDATA) goto switchD_0015ad83_caseD_4;
          if (LVar3 == LYS_EXT) {
            stmt = lys_snode2stmt(child->nodetype);
            pvVar5 = lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)plVar8,&local_48);
            if (pvVar5 == (void *)0x0) {
              pcVar6 = strnodetype(child->nodetype);
              pcVar10 = *(char **)plVar8->name;
              goto LAB_0015adad;
            }
          }
        }
        goto switchD_0015ad83_caseD_3;
      }
      if (LVar3 == LYS_GROUPING) goto switchD_0015ad83_caseD_1;
      if ((LVar3 != LYS_AUGMENT) || (LVar3 = child->nodetype, (LVar3 & 0xd0ff) != LYS_UNKNOWN))
      goto switchD_0015ad83_caseD_3;
LAB_0015aff1:
      pcVar6 = strnodetype(LVar3);
      pcVar10 = strnodetype(plVar8->nodetype);
      ecode = LYE_INCHILDSTMT;
      elem_type = LY_VLOG_LYS;
      plVar12 = local_38;
      goto LAB_0015b019;
    }
    if ((int)LVar3 < 0x200) {
      if (LVar3 == LYS_NOTIF) {
LAB_0015afab:
        LVar3 = child->nodetype;
        LVar2 = LVar3 & 0x983f;
        goto joined_r0x0015afb5;
      }
      if (LVar3 == LYS_RPC) goto LAB_0015aed7;
    }
    else if ((LVar3 == LYS_INPUT) || (LVar3 == LYS_OUTPUT)) goto LAB_0015afab;
  }
switchD_0015ad83_caseD_3:
  if ((((module->ctx->models).flags & 2) == 0) &&
     (iVar4 = lys_check_id(child,parent,module), iVar4 != 0)) {
    return 1;
  }
  if (child->parent != (lys_node *)0x0) {
    lys_node_unlink(child);
  }
  LVar3 = child->nodetype;
  if (((LVar3 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) || (parent->nodetype == LYS_EXT)) {
    if (bVar13) {
      if (parent == (lys_node *)0x0) {
        plVar8 = module->data;
        if (plVar8 == (lys_node *)0x0) {
          pplVar7 = &module->data;
        }
        else {
          plVar9 = plVar8->prev;
          pplVar7 = &plVar8->prev;
          plVar9->next = child;
          child->prev = plVar9;
        }
        *pplVar7 = child;
        bVar13 = true;
        parent = (lys_node *)0x0;
        goto LAB_0015b1d9;
      }
    }
    else {
      plVar8 = (lys_node *)calloc(1,0x70);
      if (plVar8 == (lys_node *)0x0) {
        ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_addchild");
        return 1;
      }
      pcVar10 = lydict_insert(module->ctx,child->name,0);
      plVar8->name = pcVar10;
      plVar8->flags = 0x40;
      if ((info._4_4_ & 3) == 0) {
        plVar8->flags = parent->flags & 3 | 0x40;
      }
      plVar8->module = module;
      plVar8->nodetype = LYS_CASE;
      plVar8->prev = plVar8;
      lys_node_addchild(parent,module,plVar8,info._4_4_);
      LVar3 = child->nodetype;
      parent = plVar8;
    }
    pplVar7 = lys_child(parent,LVar3);
    if (pplVar7 == (lys_node **)0x0) {
      __assert_fail("pchild",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x3ba,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
    child->parent = parent;
    if (*pplVar7 == (lys_node *)0x0) {
      *pplVar7 = child;
      plVar8 = child->next;
      plVar9 = child;
      goto LAB_0015b124;
    }
    plVar8 = (*pplVar7)->prev;
    plVar8->next = child;
    child->prev = plVar8;
    plVar11 = child;
    do {
      plVar11->parent = parent;
      plVar8 = plVar11->next;
      plVar9 = plVar11;
LAB_0015b124:
      plVar11 = plVar8;
    } while (plVar8 != (lys_node *)0x0);
    (*pplVar7)->prev = plVar9;
  }
  else {
    plVar8 = parent->child;
    while( true ) {
      if (plVar8 == (lys_node *)0x0) {
        __assert_fail("iter",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x385,
                      "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                     );
      }
      if (plVar8->nodetype == LVar3) break;
      plVar8 = plVar8->next;
    }
    if (parent->child == plVar8) {
      parent->child = child;
      plVar9 = plVar8->prev;
    }
    else {
      plVar9 = plVar8->prev;
      plVar9->next = child;
    }
    child->prev = plVar9;
    plVar9 = plVar8->next;
    child->next = plVar9;
    if (plVar9 == (lys_node *)0x0) {
      plVar9 = parent->child;
    }
    plVar9->prev = child;
    child->parent = parent;
    plVar8->next = (lys_node *)0x0;
    plVar8->prev = plVar8;
    plVar8->parent = (lys_node *)0x0;
    lys_node_free(plVar8,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  }
  plVar12 = local_38;
  bVar13 = parent == (lys_node *)0x0;
  plVar8 = parent;
  if (bVar13) {
    parent = (lys_node *)0x0;
  }
  else {
    do {
      if ((plVar8->nodetype & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING)) != LYS_UNKNOWN) goto LAB_0015b1d9;
      pplVar7 = &plVar8->parent;
      plVar8 = *pplVar7;
    } while (*pplVar7 != (lys_node *)0x0);
    if (parent != (lys_node *)0x0) {
      plVar8 = child;
      if (child != (lys_node *)0x0) {
        do {
          if ((plVar8->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
          goto LAB_0015b1d9;
          pplVar7 = &plVar8->parent;
          plVar8 = *pplVar7;
        } while (*pplVar7 != (lys_node *)0x0);
      }
      if (((parent->flags & 2) != 0) && ((child->flags & 1) != 0)) {
        ly_vlog(local_38,LYE_INARG,LY_VLOG_LYS,child,"true","config");
        ly_vlog(plVar12,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "State nodes cannot have configuration nodes as children.");
        return 1;
      }
      goto LAB_0015b1d9;
    }
  }
  bVar13 = true;
LAB_0015b1d9:
  LVar3 = child->nodetype;
  if (((LVar3 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
       LYS_UNKNOWN) && (!(bool)((child->flags & 0x80) == 0 | bVar13))) {
    do {
      if ((parent->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
        if ((char)parent->flags < '\0') break;
        parent->flags = parent->flags | 0x80;
      }
      if (parent->nodetype == LYS_EXT) {
        if (parent->padding[1] != '\x01') break;
        parent = (lys_node *)parent->dsc;
      }
      else {
        parent = parent->parent;
        if (parent == (lys_node *)0x0) break;
      }
      if (parent->nodetype == LYS_AUGMENT) {
        parent = parent->prev;
      }
    } while (parent != (lys_node *)0x0);
  }
  if ((LVar3 & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
    return 0;
  }
  if (child->child == (lys_node *)0x0) {
    plVar8 = (lys_node *)calloc(1,0x78);
    plVar9 = (lys_node *)calloc(1,0x78);
    if (plVar8 == (lys_node *)0x0 || plVar9 == (lys_node *)0x0) {
      ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_addchild");
      free(plVar8);
      free(plVar9);
      return 1;
    }
    plVar8->nodetype = LYS_INPUT;
    pcVar10 = lydict_insert(child->module->ctx,"input",5);
    plVar8->name = pcVar10;
    plVar9->nodetype = LYS_OUTPUT;
    pcVar10 = lydict_insert(child->module->ctx,"output",6);
    plVar9->name = pcVar10;
    plVar1 = child->module;
    plVar9->module = plVar1;
    plVar8->module = plVar1;
    plVar9->parent = child;
    plVar8->parent = child;
    plVar9->flags = 0x40;
    plVar8->flags = 0x40;
    plVar8->next = plVar9;
    plVar8->prev = plVar9;
    plVar9->prev = plVar8;
    child->child = plVar8;
    return 0;
  }
  return 0;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child, int options)
{
    struct ly_ctx *ctx = child->module->ctx;
    struct lys_node *iter, **pchild, *log_parent;
    struct lys_node_inout *in, *out;
    struct lys_node_case *c;
    struct lys_node_augment *aug;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
        log_parent = parent;

        if (type == LYS_USES) {
            /* we are adding children to uses -> we must be copying grouping contents into it, so properly check the parent */
            while (log_parent && (log_parent->nodetype == LYS_USES)) {
                if (log_parent->nodetype == LYS_AUGMENT) {
                    aug = (struct lys_node_augment *)log_parent;
                    if (!aug->target) {
                        /* unresolved augment, just pass the node type check */
                        goto skip_nodetype_check;
                    }
                    log_parent = aug->target;
                } else {
                    log_parent = log_parent->parent;
                }
            }
            if (log_parent) {
                type = log_parent->nodetype;
            } else {
                type = 0;
            }
        }
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
        log_parent = NULL;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(log_parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)log_parent, &info);
        if (!p) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)log_parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

skip_nodetype_check:
    /* check identifier uniqueness */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* find the implicit input/output node */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->nodetype == child->nodetype) {
                break;
            }
        }
        assert(iter);

        /* switch the old implicit node (iter) with the new one (child) */
        if (parent->child == iter) {
            /* first child */
            parent->child = child;
        } else {
            iter->prev->next = child;
        }
        child->prev = iter->prev;
        child->next = iter->next;
        if (iter->next) {
            iter->next->prev = child;
        } else {
            /* last child */
            parent->child->prev = child;
        }
        child->parent = parent;

        /* isolate the node and free it */
        iter->next = NULL;
        iter->prev = iter;
        iter->parent = NULL;
        lys_node_free(iter, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            LY_CHECK_ERR_RETURN(!c, LOGMEM(ctx), EXIT_FAILURE);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            if (!(options & (LYS_PARSE_OPT_CFG_IGNORE | LYS_PARSE_OPT_CFG_NOINHERIT))) {
                /* get config flag from parent */
                c->flags |= parent->flags & LYS_CONFIG_MASK;
            }
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c, options);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            child->parent = parent;
            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                iter = child;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            (*pchild)->prev = iter;
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if ((child->nodetype & (LYS_RPC | LYS_ACTION)) && !child->child) {
        in = calloc(1, sizeof *in);
        out = calloc(1, sizeof *out);
        if (!in || !out) {
            LOGMEM(ctx);
            free(in);
            free(out);
            return EXIT_FAILURE;
        }
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out->nodetype = LYS_OUTPUT;
        out->name = lydict_insert(child->module->ctx, "output", 6);
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}